

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O2

void __thiscall
sfc::Map::Map(Map *this,Mode mode,uint map_width,uint map_height,uint tile_width,uint tile_height)

{
  this->_mode = mode;
  this->_map_width = map_width;
  this->_map_height = map_height;
  this->_tile_width = tile_width;
  this->_tile_height = tile_height;
  (this->_entries).super__Vector_base<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_entries).super__Vector_base<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_entries).super__Vector_base<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>::resize
            (&this->_entries,(ulong)(map_height * map_width));
  return;
}

Assistant:

Map(Mode mode = Mode::snes, unsigned map_width = 32, unsigned map_height = 32, unsigned tile_width = 8, unsigned tile_height = 8)
  : _mode(mode), _map_width(map_width), _map_height(map_height), _tile_width(tile_width), _tile_height(tile_height) {
    _entries.resize(map_width * map_height);
  }